

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

reference __thiscall
nestl::impl::list_const_iterator<int>::operator*(list_const_iterator<int> *this)

{
  int *piVar1;
  list_const_iterator<int> *this_local;
  
  if (this->m_node == (list_node_base *)0x0) {
    __assert_fail("m_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x153,
                  "reference nestl::impl::list_const_iterator<int>::operator*() const [T = int]");
  }
  if (this->m_node->m_prev == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x153,
                  "reference nestl::impl::list_const_iterator<int>::operator*() const [T = int]");
  }
  if (this->m_node->m_next == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x153,
                  "reference nestl::impl::list_const_iterator<int>::operator*() const [T = int]");
  }
  if (this->m_node->m_prev->m_next == this->m_node) {
    if (this->m_node->m_next->m_prev == this->m_node) {
      piVar1 = list_node<int>::get_reference((list_node<int> *)this->m_node);
      return piVar1;
    }
    __assert_fail("(m_node)->m_next->m_prev == (m_node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x153,
                  "reference nestl::impl::list_const_iterator<int>::operator*() const [T = int]");
  }
  __assert_fail("(m_node)->m_prev->m_next == (m_node)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                ,0x153,
                "reference nestl::impl::list_const_iterator<int>::operator*() const [T = int]");
}

Assistant:

reference operator*() const NESTL_NOEXCEPT_SPEC
    {
        NESTL_CHECK_LIST_NODE(m_node);
        return static_cast<node_t*>(m_node)->get_reference();
    }